

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttable.cc
# Opt level: O2

vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
* __thiscall
upb::generator::FastDecodeTable_abi_cxx11_
          (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           *__return_storage_ptr__,generator *this,MessageDefPtr message,DefPoolPair *pools)

{
  ushort uVar1;
  uint uVar2;
  FieldDefPtr field;
  unsigned_long __val;
  pointer ppVar3;
  pointer ppVar4;
  long lVar5;
  pointer pFVar6;
  bool bVar7;
  int iVar8;
  uint32_t uVar9;
  upb_FieldType uVar10;
  upb_CType uVar11;
  ulong uVar12;
  pointer pFVar13;
  uint64_t uVar14;
  MessageDefPtr MVar15;
  upb_MiniTable *puVar16;
  upb_MiniTableField *f;
  upb_OneofDef *puVar17;
  upb_MessageDef *m;
  upb_FileDef *puVar18;
  upb_FileDef *puVar19;
  pointer puVar20;
  byte bVar21;
  Nullable<const_char_*> pcVar22;
  Arg *__return_storage_ptr___00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *this_00;
  size_t i;
  size_type sVar23;
  long lVar24;
  pointer pFVar25;
  ulong uVar26;
  initializer_list<unsigned_long> __l;
  string_view format;
  string_view format_00;
  Arg *in_stack_fffffffffffffdf8;
  _Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> local_1f8;
  uint64_t local_1d8;
  upb_MessageDef *local_1d0;
  string cardinality;
  string type;
  TableEntry ent;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_148;
  vector<unsigned_long,_std::allocator<unsigned_long>_> breaks;
  Arg local_100;
  string size_ceil;
  Arg local_b0;
  Arg local_80;
  string local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d0 = message.ptr_;
  iVar8 = upb_MessageDef_FieldCount((upb_MessageDef *)this);
  std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::reserve
            ((vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *)&local_1f8,(long)iVar8);
  for (sVar23 = 0; pFVar13 = local_1f8._M_impl.super__Vector_impl_data._M_finish,
      pFVar6 = local_1f8._M_impl.super__Vector_impl_data._M_start, (long)iVar8 != sVar23;
      sVar23 = sVar23 + 1) {
    local_148.first._M_dataplus._M_p =
         (pointer)upb_MessageDef_Field((upb_MessageDef *)this,(int)sVar23);
    std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::emplace_back<upb::FieldDefPtr>
              ((vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *)&local_1f8,
               (FieldDefPtr *)&local_148);
  }
  if (local_1f8._M_impl.super__Vector_impl_data._M_start !=
      local_1f8._M_impl.super__Vector_impl_data._M_finish) {
    lVar24 = (long)local_1f8._M_impl.super__Vector_impl_data._M_finish -
             (long)local_1f8._M_impl.super__Vector_impl_data._M_start;
    uVar12 = lVar24 >> 3;
    lVar5 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<upb::FieldDefPtr*,std::vector<upb::FieldDefPtr,std::allocator<upb::FieldDefPtr>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<upb::generator::(anonymous_namespace)::FieldHotnessOrder(upb::MessageDefPtr)::_lambda(upb::FieldDefPtr,upb::FieldDefPtr)_1_>>
              (local_1f8._M_impl.super__Vector_impl_data._M_start,
               local_1f8._M_impl.super__Vector_impl_data._M_finish,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar24 < 0x81) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<upb::FieldDefPtr*,std::vector<upb::FieldDefPtr,std::allocator<upb::FieldDefPtr>>>,__gnu_cxx::__ops::_Iter_comp_iter<upb::generator::(anonymous_namespace)::FieldHotnessOrder(upb::MessageDefPtr)::_lambda(upb::FieldDefPtr,upb::FieldDefPtr)_1_>>
                (pFVar6,pFVar13);
    }
    else {
      pFVar25 = pFVar6 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<upb::FieldDefPtr*,std::vector<upb::FieldDefPtr,std::allocator<upb::FieldDefPtr>>>,__gnu_cxx::__ops::_Iter_comp_iter<upb::generator::(anonymous_namespace)::FieldHotnessOrder(upb::MessageDefPtr)::_lambda(upb::FieldDefPtr,upb::FieldDefPtr)_1_>>
                (pFVar6,pFVar25);
      for (; pFVar25 != pFVar13; pFVar25 = pFVar25 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<upb::FieldDefPtr*,std::vector<upb::FieldDefPtr,std::allocator<upb::FieldDefPtr>>>,__gnu_cxx::__ops::_Val_comp_iter<upb::generator::(anonymous_namespace)::FieldHotnessOrder(upb::MessageDefPtr)::_lambda(upb::FieldDefPtr,upb::FieldDefPtr)_1_>>
                  (pFVar25);
      }
    }
  }
  pFVar6 = local_1f8._M_impl.super__Vector_impl_data._M_finish;
  pFVar13 = local_1f8._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pFVar13 == pFVar6) {
      std::_Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::~_Vector_base
                (&local_1f8);
      return (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              *)(Arg *)__return_storage_ptr__;
    }
    field.ptr_ = pFVar13->ptr_;
    ent.first._M_dataplus._M_p = (pointer)&ent.first.field_2;
    ent.first._M_string_length = 0;
    ent.first.field_2._M_local_buf[0] = '\0';
    ent.second = 0;
    uVar14 = anon_unknown_0::GetEncodedTag(field);
    if (0x7fff < uVar14) goto LAB_0010db72;
    MVar15.ptr_ = upb_FieldDef_ContainingType(field.ptr_);
    puVar16 = DefPoolPair::GetMiniTable64((DefPoolPair *)local_1d0,MVar15);
    uVar9 = upb_FieldDef_Number(field.ptr_);
    f = upb_MiniTable_FindFieldByNumber(puVar16,uVar9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&type,"",(allocator<char> *)&local_148);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cardinality,"",(allocator<char> *)&local_148);
    uVar10 = upb_MiniTableField_Type(f);
    switch(uVar10) {
    case kUpb_FieldType_Double:
    case kUpb_FieldType_Fixed64:
    case kUpb_FieldType_SFixed64:
      break;
    case kUpb_FieldType_Float:
    case kUpb_FieldType_Fixed32:
    case kUpb_FieldType_SFixed32:
      break;
    case kUpb_FieldType_Int64:
    case kUpb_FieldType_UInt64:
      break;
    case kUpb_FieldType_Int32:
    case kUpb_FieldType_UInt32:
switchD_0010d81e_caseD_5:
      break;
    case kUpb_FieldType_Bool:
      break;
    case kUpb_FieldType_String:
      break;
    default:
      goto switchD_0010d81e_caseD_a;
    case kUpb_FieldType_Message:
      break;
    case kUpb_FieldType_Bytes:
      break;
    case kUpb_FieldType_Enum:
      if (f->descriptortype_dont_copy_me__upb_internal_use_only != '\x0e')
      goto switchD_0010d81e_caseD_5;
      goto switchD_0010d81e_caseD_a;
    case kUpb_FieldType_SInt32:
      break;
    case kUpb_FieldType_SInt64:
    }
    std::__cxx11::string::assign((char *)&type);
    bVar21 = f->mode_dont_copy_me__upb_internal_use_only & 3;
    if ((bVar21 == 2) || (bVar21 == 1)) {
      std::__cxx11::string::assign((char *)&cardinality);
      local_1d8 = anon_unknown_0::GetEncodedTag(field);
      uVar2._0_2_ = f->offset_dont_copy_me__upb_internal_use_only;
      uVar2._2_2_ = f->presence;
      upb_FieldDef_IsRepeated(field.ptr_);
      puVar17 = upb_FieldDef_RealContainingOneof(field.ptr_);
      uVar1 = f->presence;
      if (puVar17 != (upb_OneofDef *)0x0) {
        if (((short)uVar1 < 0) && (uVar9 = upb_FieldDef_Number(field.ptr_), uVar9 < 0x100)) {
          uVar9 = upb_FieldDef_Number(field.ptr_);
          uVar12 = (ulong)CONCAT24(uVar1,uVar9 << 0x18) ^ 0xffff00000000;
          goto LAB_0010d951;
        }
        goto switchD_0010d81e_caseD_a;
      }
      uVar12 = 0x3f;
      if (((ulong)uVar1 != 0) && (uVar12 = (ulong)uVar1, 0x1f < uVar1))
      goto switchD_0010d81e_caseD_a;
      uVar12 = uVar12 << 0x18;
LAB_0010d951:
      uVar11 = upb_FieldDef_CType(field.ptr_);
      uVar12 = uVar12 | local_1d8 | (ulong)uVar2 << 0x30;
      if (uVar11 == kUpb_CType_Message) {
        uVar1 = f->submsg_index_dont_copy_me__upb_internal_use_only;
        if (0xff < uVar1) goto switchD_0010d81e_caseD_a;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&size_ceil,"max",(allocator<char> *)&local_148);
        m = upb_FieldDef_MessageSubDef(field.ptr_);
        puVar18 = upb_MessageDef_File(m);
        puVar19 = upb_FieldDef_File(field.ptr_);
        uVar26 = 0xffffffffffffffff;
        if (puVar18 == puVar19) {
          MVar15.ptr_ = upb_FieldDef_MessageSubDef(field.ptr_);
          puVar16 = DefPoolPair::GetMiniTable64((DefPoolPair *)local_1d0,MVar15);
          uVar26 = (ulong)puVar16->size_dont_copy_me__upb_internal_use_only + 8;
        }
        local_148.first.field_2._M_allocated_capacity = 0xc0;
        local_148.first.field_2._8_8_ = 0x100;
        local_148.first._M_dataplus._M_p = (pointer)0x40;
        local_148.first._M_string_length = 0x80;
        __l._M_len = 4;
        __l._M_array = (iterator)&local_148;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&breaks,__l,(allocator_type *)&local_100);
        uVar12 = (ulong)uVar1 << 0x10 | uVar12;
        puVar20 = breaks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          if (puVar20 ==
              breaks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish) goto LAB_0010da6f;
          __val = *puVar20;
          puVar20 = puVar20 + 1;
        } while (__val < uVar26);
        std::__cxx11::to_string(&local_148.first,__val);
        std::__cxx11::string::operator=((string *)&size_ceil,(string *)&local_148);
        std::__cxx11::string::~string((string *)&local_148);
LAB_0010da6f:
        local_148.first._M_dataplus._M_p = (pointer)cardinality._M_string_length;
        local_148.first._M_string_length = (size_type)cardinality._M_dataplus._M_p;
        local_100.piece_._M_len = type._M_string_length;
        local_100.piece_._M_str = type._M_dataplus._M_p;
        pcVar22 = "1";
        if (0xff < local_1d8) {
          pcVar22 = "2";
        }
        local_b0.piece_ = absl::lts_20240722::NullSafeStringView(pcVar22);
        local_80.piece_._M_len = size_ceil._M_string_length;
        local_80.piece_._M_str = size_ceil._M_dataplus._M_p;
        in_stack_fffffffffffffdf8 = &local_80;
        format._M_str = (char *)&local_148;
        format._M_len = (size_t)"upb_p$0$1_$2bt_max$3b";
        absl::lts_20240722::Substitute_abi_cxx11_
                  (&local_50,(lts_20240722 *)0x15,format,&local_100,&local_b0,
                   in_stack_fffffffffffffdf8,(Arg *)__return_storage_ptr__);
        std::__cxx11::string::operator=((string *)&ent,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&breaks.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
        __return_storage_ptr___00 = (Arg *)&size_ceil;
      }
      else {
        local_148.first._M_dataplus._M_p = (pointer)cardinality._M_string_length;
        local_148.first._M_string_length = (size_type)cardinality._M_dataplus._M_p;
        local_100.piece_._M_len = type._M_string_length;
        local_100.piece_._M_str = type._M_dataplus._M_p;
        pcVar22 = "1";
        if (0xff < local_1d8) {
          pcVar22 = "2";
        }
        local_b0.piece_ = absl::lts_20240722::NullSafeStringView(pcVar22);
        __return_storage_ptr___00 = &local_80;
        format_00._M_str = (char *)&local_148;
        format_00._M_len = (size_t)"upb_p$0$1_$2bt";
        absl::lts_20240722::Substitute_abi_cxx11_
                  ((string *)__return_storage_ptr___00,(lts_20240722 *)0xe,format_00,&local_100,
                   &local_b0,in_stack_fffffffffffffdf8);
        std::__cxx11::string::operator=((string *)&ent,(string *)__return_storage_ptr___00);
      }
      std::__cxx11::string::~string((string *)__return_storage_ptr___00);
      uVar26 = (ulong)((uint)(uVar14 >> 3) & 0x1f);
      ent.second = uVar12;
      std::__cxx11::string::~string((string *)&cardinality);
      this_00 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                 *)&type;
      while( true ) {
        std::__cxx11::string::~string((string *)this_00);
        ppVar3 = (((_Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    *)&((Arg *)__return_storage_ptr__)->piece_)->_M_impl).super__Vector_impl_data.
                 _M_start;
        ppVar4 = (((_Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                    *)&((Arg *)__return_storage_ptr__)->piece_)->_M_impl).super__Vector_impl_data.
                 _M_finish;
        uVar12 = ((long)ppVar4 - (long)ppVar3) / 0x28;
        if (uVar26 < uVar12) break;
        local_100.piece_._M_len = local_100.piece_._M_len & 0xffffffff00000000;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
        ::pair<const_char_(&)[31],_int,_true>
                  (&local_148,(char (*) [31])"_upb_FastDecoder_DecodeGeneric",(int *)&local_100);
        sVar23 = uVar12 * 2;
        if (ppVar4 == ppVar3) {
          sVar23 = 1;
        }
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ::resize(__return_storage_ptr__,sVar23,&local_148);
        this_00 = &local_148;
      }
      bVar7 = std::operator!=(&ppVar3[uVar26].first,"_upb_FastDecoder_DecodeGeneric");
      if (!bVar7) {
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
        ::operator=((((_Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                       *)&((Arg *)__return_storage_ptr__)->piece_)->_M_impl).super__Vector_impl_data
                    ._M_start + uVar26,&ent);
      }
    }
    else {
switchD_0010d81e_caseD_a:
      std::__cxx11::string::~string((string *)&cardinality);
      std::__cxx11::string::~string((string *)&type);
    }
LAB_0010db72:
    std::__cxx11::string::~string((string *)&ent);
    pFVar13 = pFVar13 + 1;
  } while( true );
}

Assistant:

std::vector<TableEntry> FastDecodeTable(upb::MessageDefPtr message,
                                        const DefPoolPair& pools) {
  std::vector<TableEntry> table;
  for (const auto field : FieldHotnessOrder(message)) {
    TableEntry ent;
    int slot = GetTableSlot(field);
    // std::cerr << "table slot: " << field->number() << ": " << slot << "\n";
    if (slot < 0) {
      // Tag can't fit in the table.
      continue;
    }
    if (!TryFillTableEntry(pools, field, ent)) {
      // Unsupported field type or offset, hasbit index, etc. doesn't fit.
      continue;
    }
    while ((size_t)slot >= table.size()) {
      size_t size = std::max(static_cast<size_t>(1), table.size() * 2);
      table.resize(size, TableEntry{"_upb_FastDecoder_DecodeGeneric", 0});
    }
    if (table[slot].first != "_upb_FastDecoder_DecodeGeneric") {
      // A hotter field already filled this slot.
      continue;
    }
    table[slot] = ent;
  }
  return table;
}